

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O1

void modifyChannels<Imath_3_2::half>
               (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                *channels,half delta)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  char cVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  float fVar10;
  uint uVar11;
  _List_node_base *p_Var12;
  float fVar13;
  
  p_Var8 = (channels->
           super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)channels) {
    do {
      lVar5 = _imath_half_to_float_table;
      p_Var1 = p_Var8[1]._M_next;
      if (0 < (long)p_Var1) {
        p_Var2 = p_Var8[1]._M_prev;
        lVar6 = 0;
        p_Var12 = (_List_node_base *)0x0;
        do {
          if (0 < (long)p_Var2) {
            p_Var3 = p_Var8[2]._M_next;
            p_Var9 = (_List_node_base *)0x0;
            do {
              fVar13 = *(float *)(lVar5 + (ulong)*(ushort *)
                                                  ((long)&p_Var3->_M_next + (long)p_Var9 * 2 + lVar6
                                                  ) * 4) + *(float *)(lVar5 + (ulong)delta._h * 4);
              fVar10 = ABS(fVar13);
              uVar7 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
              if ((uint)fVar10 < 0x38800000) {
                if ((0x33000000 < (uint)fVar10) &&
                   (uVar11 = (uint)fVar10 & 0x7fffff | 0x800000,
                   cVar4 = (char)((uint)fVar10 >> 0x17),
                   uVar7 = uVar7 | (ushort)(uVar11 >> (0x7eU - cVar4 & 0x1f)),
                   0x80000000 < uVar11 << (cVar4 + 0xa2U & 0x1f))) {
                  uVar7 = uVar7 + 1;
                }
              }
              else if ((uint)fVar10 < 0x7f800000) {
                if ((uint)fVar10 < 0x477ff000) {
                  uVar7 = (ushort)((int)fVar10 + 0x8000fff + (uint)(((uint)fVar10 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar7;
                }
                else {
                  uVar7 = uVar7 | 0x7c00;
                }
              }
              else {
                uVar7 = uVar7 | 0x7c00;
                if (fVar10 != INFINITY) {
                  uVar11 = (uint)fVar10 >> 0xd & 0x3ff;
                  uVar7 = uVar7 | (ushort)uVar11 | (ushort)(uVar11 == 0);
                }
              }
              *(ushort *)((long)&p_Var3->_M_next + (long)p_Var9 * 2 + lVar6) = uVar7;
              p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1);
            } while (p_Var2 != p_Var9);
          }
          p_Var12 = (_List_node_base *)((long)&p_Var12->_M_next + 1);
          lVar6 = lVar6 + (long)p_Var2 * 2;
        } while (p_Var12 != p_Var1);
      }
      p_Var8 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                  *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var8 != (_List_node_base *)channels);
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}